

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O0

vm_obj_id_t
CVmObjFileName::combine_path(char *path,size_t pathl,char *file,size_t filel,int literal)

{
  uint uVar1;
  size_t *psVar2;
  long *plVar3;
  undefined8 *puVar4;
  long in_RCX;
  long in_RSI;
  err_frame_t err_cur__;
  vm_obj_id_t id;
  char *filez;
  char *pathz;
  char *buf;
  size_t buflen;
  size_t in_stack_fffffffffffffeb8;
  char *pcVar5;
  char *in_stack_fffffffffffffec0;
  size_t buflen_00;
  char *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed4;
  char *in_stack_fffffffffffffee0;
  __jmp_buf_tag _Stack_118;
  vm_obj_id_t local_4c;
  char *local_48;
  char *local_40;
  char *local_38;
  ulong local_30;
  
  local_30 = in_RSI + in_RCX + 0x20;
  if (local_30 < 0x1000) {
    local_30 = 0x1000;
  }
  local_38 = (char *)0x0;
  local_40 = (char *)0x0;
  local_48 = (char *)0x0;
  local_4c = 0;
  psVar2 = (size_t *)_ZTW11G_err_frame();
  buflen_00 = *psVar2;
  plVar3 = (long *)_ZTW11G_err_frame();
  *plVar3 = (long)&stack0xfffffffffffffed0;
  uVar1 = _setjmp(&_Stack_118);
  if (uVar1 == 0) {
    local_40 = lib_copy_str(in_stack_fffffffffffffec8,(size_t)in_stack_fffffffffffffec0);
    local_48 = lib_copy_str(in_stack_fffffffffffffec8,(size_t)in_stack_fffffffffffffec0);
    local_38 = lib_alloc_str((size_t)in_stack_fffffffffffffec0);
    fn_build_full_path(in_stack_fffffffffffffee0,buflen_00,
                       (char *)CONCAT44(in_stack_fffffffffffffed4,uVar1),in_stack_fffffffffffffec8,
                       (int)((ulong)in_stack_fffffffffffffec0 >> 0x20));
    strlen(local_38);
    local_4c = create_from_local(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  }
  if ((uVar1 & 0x8000) == 0) {
    lib_free_str((char *)0x2e8c8b);
    lib_free_str((char *)0x2e8c98);
    lib_free_str((char *)0x2e8ca5);
  }
  psVar2 = (size_t *)_ZTW11G_err_frame();
  *psVar2 = buflen_00;
  if ((uVar1 & 0x4001) != 0) {
    puVar4 = (undefined8 *)_ZTW11G_err_frame();
    pcVar5 = in_stack_fffffffffffffee0;
    if ((*(uint *)*puVar4 & 2) != 0) {
      plVar3 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar3 + 0x10));
      pcVar5 = in_stack_fffffffffffffee0;
    }
    in_stack_fffffffffffffee0 = pcVar5;
    plVar3 = (long *)_ZTW11G_err_frame();
    *(char **)(*plVar3 + 0x10) = pcVar5;
    err_rethrow();
  }
  if ((uVar1 & 2) != 0) {
    free(in_stack_fffffffffffffee0);
  }
  return local_4c;
}

Assistant:

vm_obj_id_t CVmObjFileName::combine_path(
    VMG_ const char *path, size_t pathl, const char *file, size_t filel,
    int literal)
{
    /* 
     *   Estimate the space we'll need for the combined result.  This is just
     *   the sum of the two sizes on most systems, plus a path separator.  On
     *   some older systems this might add a bit more overhead, such as VMS
     *   bracket notation for the directory.  Pad it out a bit to be safe.
     */
    size_t buflen = pathl + filel + 32;
    if (buflen < OSFNMAX)
        buflen = OSFNMAX;

    char *buf = 0, *pathz = 0, *filez = 0;
    vm_obj_id_t id = VM_INVALID_OBJ;
    err_try
    {
        /* allocate null-terminated copies of the source strings */
        pathz = lib_copy_str(path, pathl);
        filez = lib_copy_str(file, filel);

        /* allocate the result buffer */
        buf = lib_alloc_str(buflen);

        /* build the full path */
        fn_build_full_path(vmg_ buf, buflen, pathz, filez, literal);

        /* create the FileName for the combined path */
        id = create_from_local(vmg_ buf, strlen(buf));
    }